

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall
pstore::file::file_handle::operator=::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this)

{
  int in_ESI;
  anon_class_8_1_8991fb9c *this_local;
  
  close(this->this,in_ESI);
  return;
}

Assistant:

file_handle & file_handle::operator= (file_handle && rhs) noexcept {
            no_ex_escape ([this] () { this->close (); });

            path_ = std::move (rhs.path_);
            file_ = rhs.file_;
            is_writable_ = rhs.is_writable_;

            rhs.file_ = invalid_oshandle;
            rhs.is_writable_ = false;
            return *this;
        }